

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * chaiscript::exception::eval_error::format_why(string *__return_storage_ptr__,string *t_why)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Error: \"",t_why);
  std::operator+(__return_storage_ptr__,&local_30,"\"");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_why(const std::string &t_why) { return "Error: \"" + t_why + "\""; }